

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdarg.c
# Opt level: O2

int test(int s,...)

{
  longdouble lVar1;
  code *pcVar2;
  longdouble lVar3;
  char in_AL;
  int iVar4;
  longdouble *plVar5;
  double *pdVar6;
  long *plVar7;
  int *piVar8;
  undefined8 *puVar9;
  uint *puVar10;
  undefined8 in_RCX;
  ulong uVar11;
  undefined8 in_RDX;
  char *pcVar12;
  undefined8 in_RSI;
  undefined8 uVar13;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  double local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  lVar3 = _DAT_00104010;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 8;
  ap[0].fp_offset = 0x30;
  local_e8[1] = (double)in_RSI;
  local_e8[2] = (double)in_RDX;
  local_e8[3] = (double)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  do {
    do {
    } while (8 < (uint)s);
    switch(s) {
    case 0:
      return (&switchD_001022d4::switchdataD_00104028)[(uint)s] + 0x104028;
    case 1:
      uVar11 = ap[0]._0_8_ & 0xffffffff;
      if (uVar11 < 0x29) {
        piVar8 = (int *)((long)local_e8 + uVar11);
        uVar11 = (ulong)(ap[0].gp_offset + 8);
        ap[0].gp_offset = ap[0].gp_offset + 8;
      }
      else {
        piVar8 = (int *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      if (*piVar8 != 0x7fffffff) {
        uVar13 = 0x2b;
        pcVar12 = "va_arg( ap, int ) == INT_MAX";
LAB_00102522:
        TEST_RESULTS = TEST_RESULTS + 1;
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/stdarg.c, line %d - %s\n"
               ,uVar13,pcVar12);
        uVar11 = ap[0]._0_8_ & 0xffffffff;
      }
      break;
    case 2:
      uVar11 = ap[0]._0_8_ & 0xffffffff;
      if (uVar11 < 0x29) {
        plVar7 = (long *)((long)local_e8 + uVar11);
        uVar11 = (ulong)(ap[0].gp_offset + 8);
        ap[0].gp_offset = ap[0].gp_offset + 8;
      }
      else {
        plVar7 = (long *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      if (*plVar7 != 0x7fffffffffffffff) {
        uVar13 = 0x32;
        pcVar12 = "va_arg( ap, long ) == LONG_MAX";
        goto LAB_00102522;
      }
      break;
    case 3:
      uVar11 = ap[0]._0_8_ & 0xffffffff;
      if (uVar11 < 0x29) {
        plVar7 = (long *)((long)local_e8 + uVar11);
        uVar11 = (ulong)(ap[0].gp_offset + 8);
        ap[0].gp_offset = ap[0].gp_offset + 8;
      }
      else {
        plVar7 = (long *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      if (*plVar7 != 0x7fffffffffffffff) {
        uVar13 = 0x39;
        pcVar12 = "va_arg( ap, long long ) == LLONG_MAX";
        goto LAB_00102522;
      }
      break;
    case 4:
      uVar11 = (ulong)ap[0].fp_offset;
      if (uVar11 < 0xa1) {
        ap[0].fp_offset = ap[0].fp_offset + 0x10;
        pdVar6 = (double *)((long)local_e8 + uVar11);
      }
      else {
        pdVar6 = (double *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      if ((*pdVar6 != 1.79769313486232e+308) || (NAN(*pdVar6))) {
        TEST_RESULTS = TEST_RESULTS + 1;
        uVar13 = 0x40;
        pcVar12 = "va_arg( ap, double ) == DBL_MAX";
LAB_0010258c:
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/stdarg.c, line %d - %s\n"
               ,uVar13,pcVar12);
      }
      goto LAB_00102593;
    case 5:
      plVar5 = (longdouble *)((long)ap[0].overflow_arg_area + 0xfU & 0xfffffffffffffff0);
      ap[0].overflow_arg_area = plVar5 + 1;
      lVar1 = *plVar5;
      if ((lVar1 != lVar3) || (NAN(lVar1) || NAN(lVar3))) {
        TEST_RESULTS = TEST_RESULTS + 1;
        uVar13 = 0x47;
        pcVar12 = "va_arg( ap, long double ) == LDBL_MAX";
        goto LAB_0010258c;
      }
      goto LAB_00102593;
    case 6:
      uVar11 = ap[0]._0_8_ & 0xffffffff;
      if (uVar11 < 0x29) {
        puVar9 = (undefined8 *)((long)local_e8 + uVar11);
        uVar11 = (ulong)(ap[0].gp_offset + 8);
        ap[0].gp_offset = ap[0].gp_offset + 8;
      }
      else {
        puVar9 = (undefined8 *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      if (*(int *)*puVar9 != 0x7fffffff) {
        uVar13 = 0x4e;
        pcVar12 = "*( va_arg( ap, int * ) ) == INT_MAX";
        goto LAB_00102522;
      }
      break;
    case 7:
      uVar11 = ap[0]._0_8_ & 0xffffffff;
      if (uVar11 < 0x29) {
        puVar9 = (undefined8 *)((long)local_e8 + uVar11);
        uVar11 = (ulong)(ap[0].gp_offset + 8);
        ap[0].gp_offset = ap[0].gp_offset + 8;
      }
      else {
        puVar9 = (undefined8 *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      if ((*(longdouble *)*puVar9 != lVar3) || (NAN(*(longdouble *)*puVar9) || NAN(lVar3))) {
        uVar13 = 0x55;
        pcVar12 = "*( va_arg( ap, long double * ) ) == LDBL_MAX";
        goto LAB_00102522;
      }
      break;
    case 8:
      uVar11 = ap[0]._0_8_ & 0xffffffff;
      if (uVar11 < 0x29) {
        ap[0].gp_offset = ap[0].gp_offset + 8;
        puVar9 = (undefined8 *)((long)local_e8 + uVar11);
      }
      else {
        puVar9 = (undefined8 *)ap[0].overflow_arg_area;
        ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
      }
      pcVar2 = (code *)*puVar9;
      if (pcVar2 != dummy) {
        TEST_RESULTS = TEST_RESULTS + 1;
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/stdarg.c, line %d - %s\n"
               ,0x5d,"( function = va_arg( ap, intfunc_t ) ) == dummy");
      }
      iVar4 = (*pcVar2)();
      if (iVar4 != 0x7fffffff) {
        TEST_RESULTS = TEST_RESULTS + 1;
        uVar13 = 0x5e;
        pcVar12 = "function() == INT_MAX";
        goto LAB_0010258c;
      }
LAB_00102593:
      uVar11 = ap[0]._0_8_ & 0xffffffff;
      if (0x28 < uVar11) goto LAB_001025ac;
      ap[0].gp_offset = ap[0].gp_offset + 8;
      puVar10 = (uint *)((long)local_e8 + uVar11);
      goto LAB_001025ba;
    }
    if ((uint)uVar11 < 0x29) {
      puVar10 = (uint *)((long)local_e8 + uVar11);
      ap[0].gp_offset = (uint)uVar11 + 8;
    }
    else {
LAB_001025ac:
      puVar10 = (uint *)ap[0].overflow_arg_area;
      ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
    }
LAB_001025ba:
    s = *puVar10;
  } while( true );
}

Assistant:

static int test( int s, ... )
{
    va_list ap;
    va_start( ap, s );

    for ( ;; )
    {
        switch ( s )
        {
            case TAG_INT:
            {
                TESTCASE( va_arg( ap, int ) == INT_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_LONG:
            {
                TESTCASE( va_arg( ap, long ) == LONG_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_LLONG:
            {
                TESTCASE( va_arg( ap, long long ) == LLONG_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_DBL:
            {
                TESTCASE( va_arg( ap, double ) == DBL_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_LDBL:
            {
                TESTCASE( va_arg( ap, long double ) == LDBL_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_INTPTR:
            {
                TESTCASE( *( va_arg( ap, int * ) ) == INT_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_LDBLPTR:
            {
                TESTCASE( *( va_arg( ap, long double * ) ) == LDBL_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_FUNCPTR:
            {
                intfunc_t function;
                TESTCASE( ( function = va_arg( ap, intfunc_t ) ) == dummy );
                TESTCASE( function() == INT_MAX );
                s = va_arg( ap, int );
                break;
            }

            case TAG_END:
            {
                va_end( ap );
                return 0;
            }
        }
    }
}